

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryDump
          (AssbinExport *this,char *pFile,IOSystem *pIOSystem,aiScene *pScene)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  tm *__tp;
  char *pcVar3;
  undefined4 extraout_var_00;
  void *pvVar4;
  DeadlyImportError *this_00;
  allocator local_241;
  IOSystem *local_240;
  char cmd [2];
  uLongf compressedSize;
  aiScene *local_228;
  uLongf uncompressedSize;
  time_t tt;
  string local_210;
  AssbinChunkWriter local_1f0;
  char buff [256];
  tm now;
  char s [64];
  IOStream *stream;
  
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wb");
  stream = (IOStream *)CONCAT44(extraout_var,iVar2);
  if (stream != (IOStream *)0x0) {
    local_240 = pIOSystem;
    local_228 = pScene;
    tt = time((time_t *)0x0);
    __tp = gmtime_r(&tt,(tm *)&now);
    s[0x30] = '\0';
    s[0x31] = '\0';
    s[0x32] = '\0';
    s[0x33] = '\0';
    s[0x34] = '\0';
    s[0x35] = '\0';
    s[0x36] = '\0';
    s[0x37] = '\0';
    s[0x38] = '\0';
    s[0x39] = '\0';
    s[0x3a] = '\0';
    s[0x3b] = '\0';
    s[0x3c] = '\0';
    s[0x3d] = '\0';
    s[0x3e] = '\0';
    s[0x3f] = '\0';
    s[0x20] = '\0';
    s[0x21] = '\0';
    s[0x22] = '\0';
    s[0x23] = '\0';
    s[0x24] = '\0';
    s[0x25] = '\0';
    s[0x26] = '\0';
    s[0x27] = '\0';
    s[0x28] = '\0';
    s[0x29] = '\0';
    s[0x2a] = '\0';
    s[0x2b] = '\0';
    s[0x2c] = '\0';
    s[0x2d] = '\0';
    s[0x2e] = '\0';
    s[0x2f] = '\0';
    s[0x10] = '\0';
    s[0x11] = '\0';
    s[0x12] = '\0';
    s[0x13] = '\0';
    s[0x14] = '\0';
    s[0x15] = '\0';
    s[0x16] = '\0';
    s[0x17] = '\0';
    s[0x18] = '\0';
    s[0x19] = '\0';
    s[0x1a] = '\0';
    s[0x1b] = '\0';
    s[0x1c] = '\0';
    s[0x1d] = '\0';
    s[0x1e] = '\0';
    s[0x1f] = '\0';
    s[0] = '\0';
    s[1] = '\0';
    s[2] = '\0';
    s[3] = '\0';
    s[4] = '\0';
    s[5] = '\0';
    s[6] = '\0';
    s[7] = '\0';
    s[8] = '\0';
    s[9] = '\0';
    s[10] = '\0';
    s[0xb] = '\0';
    s[0xc] = '\0';
    s[0xd] = '\0';
    s[0xe] = '\0';
    s[0xf] = '\0';
    pcVar3 = asctime(__tp);
    snprintf(s,0x40,"ASSIMP.binary-dump.%s",pcVar3);
    (*stream->_vptr_IOStream[3])(stream,s,0x2c,1);
    buff[0] = '\x01';
    buff[1] = '\0';
    buff[2] = '\0';
    buff[3] = '\0';
    Write<unsigned_int>(stream,(uint *)buff);
    buff[0] = '\0';
    buff[1] = '\0';
    buff[2] = '\0';
    buff[3] = '\0';
    Write<unsigned_int>(stream,(uint *)buff);
    buff._0_4_ = aiGetVersionRevision();
    Write<unsigned_int>(stream,(uint *)buff);
    buff._0_4_ = aiGetCompileFlags();
    Write<unsigned_int>(stream,(uint *)buff);
    buff._0_2_ = (ushort)this->shortened;
    (*stream->_vptr_IOStream[3])(stream,buff,2,1);
    buff[1] = '\0';
    buff[0] = this->compressed;
    (*stream->_vptr_IOStream[3])(stream,buff,2,1);
    strncpy(buff,pFile,0x100);
    (*stream->_vptr_IOStream[3])(stream,buff,1,0x100);
    cmd[0] = '\0';
    cmd[1] = '\0';
    strncpy(buff,cmd,0x80);
    (*stream->_vptr_IOStream[3])(stream,buff,1,0x80);
    buff[0] = -0x33;
    buff[1] = -0x33;
    buff[2] = -0x33;
    buff[3] = -0x33;
    buff[4] = -0x33;
    buff[5] = -0x33;
    buff[6] = -0x33;
    buff[7] = -0x33;
    buff[8] = -0x33;
    buff[9] = -0x33;
    buff[10] = -0x33;
    buff[0xb] = -0x33;
    buff[0xc] = -0x33;
    buff[0xd] = -0x33;
    buff[0xe] = -0x33;
    buff[0xf] = -0x33;
    buff[0x10] = -0x33;
    buff[0x11] = -0x33;
    buff[0x12] = -0x33;
    buff[0x13] = -0x33;
    buff[0x14] = -0x33;
    buff[0x15] = -0x33;
    buff[0x16] = -0x33;
    buff[0x17] = -0x33;
    buff[0x18] = -0x33;
    buff[0x19] = -0x33;
    buff[0x1a] = -0x33;
    buff[0x1b] = -0x33;
    buff[0x1c] = -0x33;
    buff[0x1d] = -0x33;
    buff[0x1e] = -0x33;
    buff[0x1f] = -0x33;
    buff[0x20] = -0x33;
    buff[0x21] = -0x33;
    buff[0x22] = -0x33;
    buff[0x23] = -0x33;
    buff[0x24] = -0x33;
    buff[0x25] = -0x33;
    buff[0x26] = -0x33;
    buff[0x27] = -0x33;
    buff[0x28] = -0x33;
    buff[0x29] = -0x33;
    buff[0x2a] = -0x33;
    buff[0x2b] = -0x33;
    buff[0x2c] = -0x33;
    buff[0x2d] = -0x33;
    buff[0x2e] = -0x33;
    buff[0x2f] = -0x33;
    buff[0x30] = -0x33;
    buff[0x31] = -0x33;
    buff[0x32] = -0x33;
    buff[0x33] = -0x33;
    buff[0x34] = -0x33;
    buff[0x35] = -0x33;
    buff[0x36] = -0x33;
    buff[0x37] = -0x33;
    buff[0x38] = -0x33;
    buff[0x39] = -0x33;
    buff[0x3a] = -0x33;
    buff[0x3b] = -0x33;
    buff[0x3c] = -0x33;
    buff[0x3d] = -0x33;
    buff[0x3e] = -0x33;
    buff[0x3f] = -0x33;
    (*stream->_vptr_IOStream[3])(stream,buff,1,0x40);
    iVar2 = (*stream->_vptr_IOStream[5])(stream);
    if (CONCAT44(extraout_var_00,iVar2) != 0x200) {
      __assert_fail("out->Tell() == 512",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Assbin/AssbinExporter.cpp"
                    ,0x324,
                    "void Assimp::AssbinExport::WriteBinaryDump(const char *, IOSystem *, const aiScene *)"
                   );
    }
    if (this->compressed == true) {
      local_1f0.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0071bcb8;
      local_1f0.buffer = (uint8_t *)0x0;
      local_1f0.magic = 0;
      local_1f0.container = (IOStream *)0x0;
      local_1f0.cur_size = 0;
      local_1f0.cursor = 0;
      local_1f0.initial = 0x1000;
      WriteBinaryScene(this,&local_1f0.super_IOStream,local_228);
      sVar1 = local_1f0.cursor;
      uncompressedSize = local_1f0.cursor;
      compressedSize = compressBound(local_1f0.cursor);
      pvVar4 = operator_new__(compressedSize);
      iVar2 = compress2(pvVar4,&compressedSize,local_1f0.buffer,sVar1,9);
      if (iVar2 != 0) {
        operator_delete__(pvVar4);
        (*local_240->_vptr_IOSystem[5])(local_240,stream);
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_210,"Compression failed.",&local_241);
        DeadlyImportError::DeadlyImportError(this_00,&local_210);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      (*stream->_vptr_IOStream[3])(stream,&uncompressedSize,4,1);
      (*stream->_vptr_IOStream[3])(stream,pvVar4,1,compressedSize);
      operator_delete__(pvVar4);
      AssbinChunkWriter::~AssbinChunkWriter(&local_1f0);
    }
    else {
      WriteBinaryScene(this,stream,local_228);
    }
    (*local_240->_vptr_IOSystem[5])(local_240,stream);
  }
  return;
}

Assistant:

void WriteBinaryDump(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene)
    {
        IOStream * out = pIOSystem->Open( pFile, "wb" );
        if (!out) return;

        time_t tt = time(NULL);
#if _WIN32
        tm* p     = gmtime(&tt);
#else
        struct tm now;
        tm* p = gmtime_r(&tt, &now);
#endif

        // header
        char s[64];
        memset( s, 0, 64 );
#if _MSC_VER >= 1400
        sprintf_s(s,"ASSIMP.binary-dump.%s",asctime(p));
#else
        ai_snprintf(s,64,"ASSIMP.binary-dump.%s",asctime(p));
#endif
        out->Write( s, 44, 1 );
        // == 44 bytes

        Write<unsigned int>( out, ASSBIN_VERSION_MAJOR );
        Write<unsigned int>( out, ASSBIN_VERSION_MINOR );
        Write<unsigned int>( out, aiGetVersionRevision() );
        Write<unsigned int>( out, aiGetCompileFlags() );
        Write<uint16_t>( out, shortened );
        Write<uint16_t>( out, compressed );
        // ==  20 bytes

        char buff[256];
        strncpy(buff,pFile,256);
        out->Write(buff,sizeof(char),256);

        char cmd[] = "\0";
        strncpy(buff,cmd,128);
        out->Write(buff,sizeof(char),128);

        // leave 64 bytes free for future extensions
        memset(buff,0xcd,64);
        out->Write(buff,sizeof(char),64);
        // == 435 bytes

        // ==== total header size: 512 bytes
        ai_assert( out->Tell() == ASSBIN_HEADER_LENGTH );

        // Up to here the data is uncompressed. For compressed files, the rest
        // is compressed using standard DEFLATE from zlib.
        if (compressed)
        {
            AssbinChunkWriter uncompressedStream( NULL, 0 );
            WriteBinaryScene( &uncompressedStream, pScene );

            uLongf uncompressedSize = static_cast<uLongf>(uncompressedStream.Tell());
            uLongf compressedSize = (uLongf)compressBound(uncompressedSize);
            uint8_t* compressedBuffer = new uint8_t[ compressedSize ];

            int res = compress2( compressedBuffer, &compressedSize, (const Bytef*)uncompressedStream.GetBufferPointer(), uncompressedSize, 9 );
            if(res != Z_OK)
            {
                delete [] compressedBuffer;
                pIOSystem->Close(out);
                throw DeadlyExportError("Compression failed.");
            }

            out->Write( &uncompressedSize, sizeof(uint32_t), 1 );
            out->Write( compressedBuffer, sizeof(char), compressedSize );

            delete[] compressedBuffer;
        }
        else
        {
            WriteBinaryScene( out, pScene );
        }

        pIOSystem->Close( out );
    }